

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classarray.h
# Opt level: O1

ptrdiff_t __thiscall
soplex::
ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
::reMax(ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        *this,int newMax,int newSize)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *pNVar2;
  long lVar3;
  uint n;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ptrdiff_t pVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *newMem;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_40;
  uint local_34;
  
  if (newSize < 0) {
    newSize = this->thesize;
  }
  if (newMax <= newSize) {
    newMax = newSize;
  }
  n = 1;
  if (1 < newMax) {
    n = newMax;
  }
  if (n == this->themax) {
    this->thesize = newSize;
    pVar7 = 0;
  }
  else {
    local_40 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x0;
    spx_alloc<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>*>
              (&local_40,n);
    uVar6 = 0;
    if ((0 < newSize) && (0 < this->thesize)) {
      uVar4 = (ulong)(uint)newSize;
      lVar5 = 0;
      uVar6 = 0;
      local_34 = newSize;
      do {
        pNVar2 = local_40;
        pNVar1 = this->data;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&(local_40->val).m_backend.m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar5),
                           (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)((long)&(pNVar1->val).m_backend.m_value.num.m_backend.
                                      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                      .m_data + lVar5));
        *(undefined4 *)((long)&pNVar2->idx + lVar5) = *(undefined4 *)((long)&pNVar1->idx + lVar5);
        uVar6 = uVar6 + 1;
        newSize = local_34;
        if (uVar4 <= uVar6) break;
        lVar5 = lVar5 + 0x50;
      } while ((long)uVar6 < (long)this->thesize);
    }
    if ((uint)uVar6 < n) {
      lVar3 = (uVar6 & 0xffffffff) * 0x50 + 0x40;
      lVar5 = (ulong)n - (uVar6 & 0xffffffff);
      do {
        *(undefined8 *)((long)local_40 + lVar3 + -0x40) = 0;
        *(undefined4 *)((long)local_40 + lVar3 + -0x30) = 1;
        *(undefined2 *)((long)local_40 + lVar3 + -0x2c) = 0x100;
        *(undefined1 *)((long)local_40 + lVar3 + -0x2a) = 0;
        *(undefined8 *)((long)local_40 + lVar3 + -0x20) = 1;
        *(undefined4 *)((long)local_40 + lVar3 + -0x10) = 1;
        *(undefined2 *)((long)local_40 + lVar3 + -0xc) = 0x100;
        *(undefined1 *)((long)local_40 + lVar3 + -10) = 0;
        *(undefined4 *)
         ((long)&(local_40->val).m_backend.m_value.num.m_backend.
                 super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 .m_data + lVar3) = 0;
        lVar3 = lVar3 + 0x50;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pVar7 = (long)local_40 - (long)this->data;
    lVar5 = (long)this->themax;
    if (0 < lVar5) {
      lVar3 = lVar5 + 1;
      lVar5 = lVar5 * 0x50 + -0x1a;
      do {
        pNVar1 = this->data;
        if ((*(char *)((long)pNVar1 + lVar5 + -1) == '\0') &&
           (*(char *)((long)&(pNVar1->val).m_backend.m_value.num.m_backend.
                             super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                             .m_data + lVar5) == '\0')) {
          operator_delete(*(void **)((long)pNVar1 + lVar5 + -0xe),
                          (ulong)*(uint *)((long)pNVar1 + lVar5 + -0x16) << 3);
        }
        if ((*(char *)((long)pNVar1 + lVar5 + -0x21) == '\0') &&
           (*(char *)((long)pNVar1 + lVar5 + -0x20) == '\0')) {
          operator_delete(*(void **)((long)pNVar1 + lVar5 + -0x2e),
                          (ulong)*(uint *)((long)pNVar1 + lVar5 + -0x36) << 3);
        }
        lVar3 = lVar3 + -1;
        lVar5 = lVar5 + -0x50;
      } while (1 < lVar3);
    }
    free(this->data);
    this->data = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)0x0;
    this->data = local_40;
    this->themax = n;
    this->thesize = newSize;
  }
  return pVar7;
}

Assistant:

ptrdiff_t reMax(int newMax = 1, int newSize = -1)
   {
      /* process input */
      if(newSize < 0)
         newSize = size();

      if(newMax < 1)
         newMax = 1;

      if(newMax < newSize)
         newMax = newSize;

      /* nothing to reallocate */
      if(newMax == themax)
      {
         thesize = newSize;
         return 0;
      }

      /* allocate new memory */
      T* newMem = nullptr;
      spx_alloc(newMem, newMax);

      /* call copy constructor for first elements */
      int i;

      for(i = 0; i < size() && i < newSize; i++)
         new(&(newMem[i])) T(data[i]);

      /* call default constructor for remaining elements */
      for(; i < newMax; i++)
         new(&(newMem[i])) T();

      /* compute pointer difference */
      ptrdiff_t pshift = reinterpret_cast<char*>(newMem) - reinterpret_cast<char*>(data);

      /* free old memory */
      for(i = themax - 1; i >= 0; i--)
         data[i].~T();

      spx_free(data);

      /* assign new memory */
      data = newMem;
      themax = newMax;
      thesize = newSize;

      return pshift;
   }